

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSimMv.c
# Opt level: O0

void Saig_MvSimulateFrame(Saig_MvMan_t *p,int fFirst,int fVerbose)

{
  int iVar1;
  int iFan1;
  Saig_MvObj_t *pObj;
  int local_24;
  Saig_MvObj_t *pSStack_20;
  int i;
  Saig_MvObj_t *pEntry;
  int fVerbose_local;
  int fFirst_local;
  Saig_MvMan_t *p_local;
  
  pSStack_20 = p->pAigOld;
  do {
    if ((*(uint *)&pSStack_20->field_0x8 & 7) == 7) {
      for (local_24 = 0; iVar1 = Vec_PtrSize(p->vFlops), local_24 < iVar1; local_24 = local_24 + 1)
      {
        pObj = (Saig_MvObj_t *)Vec_PtrEntry(p->vFlops,local_24);
        iVar1 = Saig_MvSimulateValue0(p->pAigOld,pObj);
        *(uint *)&pObj->field_0x8 = *(uint *)&pObj->field_0x8 & 7 | iVar1 << 3;
      }
      return;
    }
    if ((*(uint *)&pSStack_20->field_0x8 & 7) == 5) {
      iVar1 = Saig_MvSimulateValue0(p->pAigOld,pSStack_20);
      iFan1 = Saig_MvSimulateValue1(p->pAigOld,pSStack_20);
      iVar1 = Saig_MvAnd(p,iVar1,iFan1,fFirst);
      *(uint *)&pSStack_20->field_0x8 = *(uint *)&pSStack_20->field_0x8 & 7 | iVar1 << 3;
    }
    else if ((*(uint *)&pSStack_20->field_0x8 & 7) == 3) {
      iVar1 = Saig_MvSimulateValue0(p->pAigOld,pSStack_20);
      *(uint *)&pSStack_20->field_0x8 = *(uint *)&pSStack_20->field_0x8 & 7 | iVar1 << 3;
    }
    else if ((*(uint *)&pSStack_20->field_0x8 & 7) == 2) {
      if (pSStack_20->iFan1 == 0) {
        if (fFirst == 0) {
          *(uint *)&pSStack_20->field_0x8 = *(uint *)&pSStack_20->field_0x8 & 7 | 0xfffffff0;
        }
        else {
          iVar1 = Saig_MvCreateObj(p,0,0);
          iVar1 = Saig_MvVar2Lit(iVar1);
          *(uint *)&pSStack_20->field_0x8 = *(uint *)&pSStack_20->field_0x8 & 7 | iVar1 << 3;
        }
      }
    }
    else if ((*(uint *)&pSStack_20->field_0x8 & 7) == 1) {
      iVar1 = Saig_MvConst1();
      *(uint *)&pSStack_20->field_0x8 = *(uint *)&pSStack_20->field_0x8 & 7 | iVar1 << 3;
    }
    else if ((*(uint *)&pSStack_20->field_0x8 & 7) != 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/saig/saigSimMv.c"
                    ,0x1d0,"void Saig_MvSimulateFrame(Saig_MvMan_t *, int, int)");
    }
    pSStack_20 = pSStack_20 + 1;
  } while( true );
}

Assistant:

void Saig_MvSimulateFrame( Saig_MvMan_t * p, int fFirst, int fVerbose )
{
    Saig_MvObj_t * pEntry;
    int i;
    Saig_MvManForEachObj( p->pAigOld, pEntry )
    {
        if ( pEntry->Type == AIG_OBJ_AND )
        {
            pEntry->Value = Saig_MvAnd( p, 
                Saig_MvSimulateValue0(p->pAigOld, pEntry),
                Saig_MvSimulateValue1(p->pAigOld, pEntry), fFirst );
        }
        else if ( pEntry->Type == AIG_OBJ_CO )
            pEntry->Value = Saig_MvSimulateValue0(p->pAigOld, pEntry);
        else if ( pEntry->Type == AIG_OBJ_CI )
        {
            if ( pEntry->iFan1 == 0 ) // true PI
            {
                if ( fFirst )
                    pEntry->Value = Saig_MvVar2Lit( Saig_MvCreateObj( p, 0, 0 ) );
                else
                    pEntry->Value = SAIG_UNDEF_VALUE;
            }
//            else if ( fFirst ) // register output
//                pEntry->Value = Saig_MvConst0();
//            else
//                pEntry->Value = Saig_MvSimulateValue0(p->pAigOld, pEntry);
        }
        else if ( pEntry->Type == AIG_OBJ_CONST1 )
            pEntry->Value = Saig_MvConst1();
        else if ( pEntry->Type != AIG_OBJ_NONE )
            assert( 0 );
    }
    // transfer to registers
    Vec_PtrForEachEntry( Saig_MvObj_t *, p->vFlops, pEntry, i )
        pEntry->Value = Saig_MvSimulateValue0( p->pAigOld, pEntry );
}